

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier_test.cpp
# Opt level: O3

void __thiscall BarrierTest_CtorThrow_Test::TestBody(BarrierTest_CtorThrow_Test *this)

{
  bool bVar1;
  undefined4 *puVar2;
  AssertHelper local_60;
  char *local_58;
  char *local_50;
  char local_48 [16];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38 [4];
  
  local_48[0] = '\0';
  local_48[1] = '\0';
  local_48[2] = '\0';
  local_48[3] = '\0';
  local_48[4] = '\0';
  local_48[5] = '\0';
  local_48[6] = '\0';
  local_48[7] = '\0';
  local_48[8] = '\0';
  local_48[9] = '\0';
  local_48[10] = '\0';
  local_48[0xb] = '\0';
  local_48[0xc] = '\0';
  local_48[0xd] = '\0';
  local_48[0xe] = '\0';
  local_48[0xf] = '\0';
  local_50 = (char *)0x0;
  local_58 = local_48;
  bVar1 = testing::internal::AlwaysTrue();
  if (!bVar1) {
    std::__cxx11::string::_M_replace((ulong)&local_58,0,local_50,0x15a2a7);
    testing::Message::Message((Message *)local_38);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/barrier_test.cpp"
               ,0x3e,local_58);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_38[0]._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38[0]._M_head_impl + 8))();
    }
    if (local_58 != local_48) {
      operator_delete(local_58);
    }
    return;
  }
  puVar2 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar2 = 0x2a;
  __cxa_throw(puVar2,&int::typeinfo,0);
}

Assistant:

TEST(BarrierTest, CtorThrow)
{
  struct throwing_completion {
    throwing_completion() = default;
    throwing_completion(const throwing_completion&) = default;
    throwing_completion(throwing_completion&&) {
      // move constructor throw exception
      throw 42;  // int
    }
    void operator()() {}
  } completion;
  EXPECT_THROW((yamc::barrier<throwing_completion>{1, completion}), int);
}